

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatterTest_ArgErrors_Test::TestBody(FormatterTest_ArgErrors_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_8;
  char format_str [256];
  AssertionResult local_538;
  undefined1 local_528 [16];
  AssertionResult local_518;
  undefined1 local_500 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f0;
  undefined1 *local_4e8;
  long lStack_4e0;
  undefined8 local_4d8;
  undefined1 local_4d0 [504];
  AssertHelper local_2d8 [2];
  AssertHelperData local_2c8 [4];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined4 local_b8 [4];
  undefined4 local_a8 [4];
  undefined4 local_98 [4];
  undefined4 local_88 [4];
  undefined8 local_78 [2];
  undefined4 local_68 [4];
  undefined4 local_58 [4];
  undefined4 local_48 [6];
  
  testing::AssertionSuccess();
  if ((string)local_538.success_ == (string)0x1) {
    local_2d8[0].data_ = local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"invalid format string","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_b8[0] = 0;
      lStack_4e0 = 0;
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_4d8 = 500;
      format_str_00.size_ = 1;
      format_str_00.data_ = "{";
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_b8;
      args.types_ = fmt::v5::
                    format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ::TYPES;
      local_4e8 = local_4d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_4f0,format_str_00,args,(locale_ref)0x0);
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,local_4e8,local_4e8 + lStack_4e0);
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_4e8 != local_4d0) {
        operator_delete(local_4e8);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_538,
               (char (*) [93])
               "Expected: format(\"{\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_2d8[0].data_ != local_2c8) {
      operator_delete(local_2d8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_4f0);
  if (local_538.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_538.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_2d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x305,pcVar3);
  testing::internal::AssertHelper::operator=(local_2d8,(Message *)&local_4f0);
  testing::internal::AssertHelper::~AssertHelper(local_2d8);
  if (local_4f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_4f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_4f0.ptr_ + 8))();
    }
    local_4f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_538.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((string)local_538.success_ == (string)0x1) {
    local_2d8[0].data_ = local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"invalid format string","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_a8[0] = 0;
      lStack_4e0 = 0;
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_4d8 = 500;
      format_str_01.size_ = 3;
      format_str_01.data_ = "{?}";
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_a8;
      args_00.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_4e8 = local_4d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_4f0,format_str_01,args_00,(locale_ref)0x0);
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,local_4e8,local_4e8 + lStack_4e0);
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_4e8 != local_4d0) {
        operator_delete(local_4e8);
      }
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_538,
               (char (*) [95])
               "Expected: format(\"{?}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_2d8[0].data_ != local_2c8) {
      operator_delete(local_2d8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_4f0);
  if (local_538.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_538.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_2d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x306,pcVar3);
  testing::internal::AssertHelper::operator=(local_2d8,(Message *)&local_4f0);
  testing::internal::AssertHelper::~AssertHelper(local_2d8);
  if (local_4f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_4f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_4f0.ptr_ + 8))();
    }
    local_4f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_538.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((string)local_538.success_ == (string)0x1) {
    local_2d8[0].data_ = local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"invalid format string","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_98[0] = 0;
      lStack_4e0 = 0;
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_4d8 = 500;
      format_str_02.size_ = 2;
      format_str_02.data_ = "{0";
      args_01.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_98;
      args_01.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_4e8 = local_4d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_4f0,format_str_02,args_01,(locale_ref)0x0);
      local_118[0] = local_108;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,local_4e8,local_4e8 + lStack_4e0);
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_4e8 != local_4d0) {
        operator_delete(local_4e8);
      }
      if (local_118[0] != local_108) {
        operator_delete(local_118[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_538,
               (char (*) [94])
               "Expected: format(\"{0\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_2d8[0].data_ != local_2c8) {
      operator_delete(local_2d8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_4f0);
  if (local_538.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_538.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_2d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x307,pcVar3);
  testing::internal::AssertHelper::operator=(local_2d8,(Message *)&local_4f0);
  testing::internal::AssertHelper::~AssertHelper(local_2d8);
  if (local_4f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_4f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_4f0.ptr_ + 8))();
    }
    local_4f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_538.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((string)local_538.success_ == (string)0x1) {
    local_2d8[0].data_ = local_2c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2d8,"argument index out of range","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_88[0] = 0;
      lStack_4e0 = 0;
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_4d8 = 500;
      format_str_03.size_ = 3;
      format_str_03.data_ = "{0}";
      args_02.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_88;
      args_02.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_4e8 = local_4d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_4f0,format_str_03,args_02,(locale_ref)0x0);
      local_138[0] = local_128;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,local_4e8,local_4e8 + lStack_4e0);
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_4e8 != local_4d0) {
        operator_delete(local_4e8);
      }
      if (local_138[0] != local_128) {
        operator_delete(local_138[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_538,
               (char (*) [95])
               "Expected: format(\"{0}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_2d8[0].data_ != local_2c8) {
      operator_delete(local_2d8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_4f0);
  if (local_538.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_538.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_2d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x308,pcVar3);
  testing::internal::AssertHelper::operator=(local_2d8,(Message *)&local_4f0);
  testing::internal::AssertHelper::~AssertHelper(local_2d8);
  if (local_4f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_4f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_4f0.ptr_ + 8))();
    }
    local_4f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_538.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((string)local_538.success_ == (string)0x1) {
    local_2d8[0].data_ = local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"invalid format string","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_78[0] = 0x2a;
      lStack_4e0 = 0;
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_4d8 = 500;
      format_str_04.size_ = 4;
      format_str_04.data_ = "{00}";
      args_03.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_78;
      args_03.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_4e8 = local_4d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_4f0,format_str_04,args_03,(locale_ref)0x0);
      local_158[0] = local_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,local_4e8,local_4e8 + lStack_4e0);
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_4e8 != local_4d0) {
        operator_delete(local_4e8);
      }
      if (local_158[0] != local_148) {
        operator_delete(local_158[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_538,
               (char (*) [100])
               "Expected: format(\"{00}\", 42) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_2d8[0].data_ != local_2c8) {
      operator_delete(local_2d8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_4f0);
  if (local_538.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_538.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_2d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x309,pcVar3);
  testing::internal::AssertHelper::operator=(local_2d8,(Message *)&local_4f0);
  testing::internal::AssertHelper::~AssertHelper(local_2d8);
  if (local_4f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_4f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_4f0.ptr_ + 8))();
    }
    local_4f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_538.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  safe_sprintf<256ul>((char (*) [256])local_2d8,"{%u",0x7fffffff);
  testing::AssertionSuccess();
  if (local_518.success_ == true) {
    local_538._0_8_ = (AssertHelperData *)local_528;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"invalid format string","")
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      sVar2 = strlen((char *)local_2d8);
      local_68[0] = 0;
      lStack_4e0 = 0;
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_4d8 = 500;
      format_str_05.size_ = sVar2;
      format_str_05.data_ = (char *)local_2d8;
      args_04.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_68;
      args_04.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_4e8 = local_4d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_4f0,format_str_05,args_04,(locale_ref)0x0);
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,local_4e8,local_4e8 + lStack_4e0);
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_4e8 != local_4d0) {
        operator_delete(local_4e8);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_518,
               (char (*) [100])
               "Expected: format(format_str) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)local_528) {
      operator_delete((void *)local_538._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_4f0);
  if (local_518.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)local_518.message_.ptr_;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_538,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x30d,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_538,(Message *)&local_4f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_538);
  if (local_4f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_4f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_4f0.ptr_ + 8))();
    }
    local_4f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_518.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  safe_sprintf<256ul>((char (*) [256])local_2d8,"{%u}",0x7fffffff);
  testing::AssertionSuccess();
  if (local_518.success_ == true) {
    local_538._0_8_ = (AssertHelperData *)local_528;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_538,"argument index out of range","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      sVar2 = strlen((char *)local_2d8);
      local_58[0] = 0;
      lStack_4e0 = 0;
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_4d8 = 500;
      format_str_06.size_ = sVar2;
      format_str_06.data_ = (char *)local_2d8;
      args_05.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_58;
      args_05.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_4e8 = local_4d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_4f0,format_str_06,args_05,(locale_ref)0x0);
      local_198[0] = local_188;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,local_4e8,local_4e8 + lStack_4e0);
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_4e8 != local_4d0) {
        operator_delete(local_4e8);
      }
      if (local_198[0] != local_188) {
        operator_delete(local_198[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_518,
               (char (*) [100])
               "Expected: format(format_str) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)local_528) {
      operator_delete((void *)local_538._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_4f0);
  if (local_518.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)local_518.message_.ptr_;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_538,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x310,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_538,(Message *)&local_4f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_538);
  if (local_4f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_4f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_4f0.ptr_ + 8))();
    }
    local_4f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_518.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  safe_sprintf<256ul>((char (*) [256])local_2d8,"{%u",0x80000000);
  testing::AssertionSuccess();
  if (local_518.success_ == true) {
    local_538._0_8_ = (AssertHelperData *)local_528;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"number is too big","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      sVar2 = strlen((char *)local_2d8);
      local_48[0] = 0;
      lStack_4e0 = 0;
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_4d8 = 500;
      format_str_07.size_ = sVar2;
      format_str_07.data_ = (char *)local_2d8;
      args_06.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_48;
      args_06.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_4e8 = local_4d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_4f0,format_str_07,args_06,(locale_ref)0x0);
      local_1b8[0] = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,local_4e8,local_4e8 + lStack_4e0);
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_4e8 != local_4d0) {
        operator_delete(local_4e8);
      }
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_518,
               (char (*) [100])
               "Expected: format(format_str) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)local_528) {
      operator_delete((void *)local_538._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_4f0);
  if (local_518.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)local_518.message_.ptr_;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_538,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x313,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_538,(Message *)&local_4f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_538);
  if (local_4f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_4f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_4f0.ptr_ + 8))();
    }
    local_4f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_518.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  safe_sprintf<256ul>((char (*) [256])local_2d8,"{%u}",0x80000000);
  testing::AssertionSuccess();
  if (local_500[0] == '\x01') {
    local_538._0_8_ = (AssertHelperData *)local_528;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"number is too big","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      sVar2 = strlen((char *)local_2d8);
      local_518._0_4_ = 0;
      lStack_4e0 = 0;
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_4d8 = 500;
      format_str_08.size_ = sVar2;
      format_str_08.data_ = (char *)local_2d8;
      args_07.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_518;
      args_07.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_4e8 = local_4d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_4f0,format_str_08,args_07,(locale_ref)0x0);
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,local_4e8,local_4e8 + lStack_4e0);
      local_4f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_4e8 != local_4d0) {
        operator_delete(local_4e8);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)local_500,
               (char (*) [100])
               "Expected: format(format_str) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)local_528) {
      operator_delete((void *)local_538._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_4f0);
  if (local_500._8_8_ == 0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)local_500._8_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_538,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x315,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_538,(Message *)&local_4f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_538);
  if (local_4f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_4f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_4f0.ptr_ + 8))();
    }
    local_4f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&((AssertionResult *)local_500)->message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, ArgErrors) {
  EXPECT_THROW_MSG(format("{"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{?}"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0}"), format_error, "argument index out of range");
  EXPECT_THROW_MSG(format("{00}", 42), format_error, "invalid format string");

  char format_str[BUFFER_SIZE];
  safe_sprintf(format_str, "{%u", INT_MAX);
  EXPECT_THROW_MSG(format(format_str), format_error, "invalid format string");
  safe_sprintf(format_str, "{%u}", INT_MAX);
  EXPECT_THROW_MSG(format(format_str), format_error,
      "argument index out of range");

  safe_sprintf(format_str, "{%u", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str), format_error, "number is too big");
  safe_sprintf(format_str, "{%u}", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str), format_error, "number is too big");
}